

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O0

int64_t calculate_sse(MACROBLOCKD *xd,macroblock_plane *p,macroblockd_plane *pd,int bw,int bh)

{
  char cVar1;
  int iVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  MACROBLOCKD *in_RDI;
  int in_R8D;
  int shift;
  int64_t sse;
  long local_28;
  
  cVar1 = (char)in_RDI->bd + -8;
  iVar2 = is_cur_buf_hbd(in_RDI);
  if (iVar2 == 0) {
    local_28 = (*aom_sse)(*(uint8_t **)(in_RSI + 0x30),*(int *)(in_RSI + 0x48),
                          *(uint8_t **)(in_RDX + 0x10),*(int *)(in_RDX + 0x28),in_ECX,in_R8D);
  }
  else {
    local_28 = (*aom_highbd_sse)(*(uint8_t **)(in_RSI + 0x30),*(int *)(in_RSI + 0x48),
                                 *(uint8_t **)(in_RDX + 0x10),*(int *)(in_RDX + 0x28),in_ECX,in_R8D)
    ;
  }
  return local_28 + ((1 << (cVar1 * '\x02' & 0x1fU)) >> 1) >> (cVar1 * '\x02' & 0x3fU);
}

Assistant:

static int64_t calculate_sse(MACROBLOCKD *const xd,
                             const struct macroblock_plane *p,
                             struct macroblockd_plane *pd, const int bw,
                             const int bh) {
  int64_t sse = 0;
  const int shift = xd->bd - 8;
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    sse = aom_highbd_sse(p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride,
                         bw, bh);
  } else {
    sse =
        aom_sse(p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride, bw, bh);
  }
#else
  sse = aom_sse(p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride, bw, bh);
#endif
  sse = ROUND_POWER_OF_TWO(sse, shift * 2);
  return sse;
}